

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tagger.cpp
# Opt level: O0

void __thiscall
MeCab::anon_unknown_0::LatticeImpl::set_feature_constraint
          (LatticeImpl *this,size_t begin_pos,size_t end_pos,char *feature)

{
  bool bVar1;
  unsigned_long *puVar2;
  reference ppcVar3;
  vector<const_char_*,_std::allocator<const_char_*>_> *in_RCX;
  ulong in_RDX;
  ulong in_RSI;
  vector<const_char_*,_std::allocator<const_char_*>_> *in_RDI;
  size_t i;
  ulong local_38;
  value_type *in_stack_ffffffffffffffd0;
  unsigned_long local_18;
  ulong local_10;
  
  if ((in_RSI < in_RDX) && (in_RCX != (vector<const_char_*,_std::allocator<const_char_*>_> *)0x0)) {
    local_10 = in_RSI;
    bVar1 = std::vector<const_char_*,_std::allocator<const_char_*>_>::empty(in_RDI);
    if (bVar1) {
      (*(code *)(in_RDI->super__Vector_base<const_char_*,_std::allocator<const_char_*>_>)._M_impl.
                super__Vector_impl_data._M_start[0xb])();
      std::vector<const_char_*,_std::allocator<const_char_*>_>::resize
                (in_RCX,0,in_stack_ffffffffffffffd0);
    }
    (*(code *)(in_RDI->super__Vector_base<const_char_*,_std::allocator<const_char_*>_>)._M_impl.
              super__Vector_impl_data._M_start[0xb])();
    puVar2 = std::min<unsigned_long>(&local_18,(unsigned_long *)&stack0xffffffffffffffd0);
    local_18 = *puVar2;
    (*(code *)(in_RDI->super__Vector_base<const_char_*,_std::allocator<const_char_*>_>)._M_impl.
              super__Vector_impl_data._M_start[0x21])(in_RDI,local_10,1);
    (*(code *)(in_RDI->super__Vector_base<const_char_*,_std::allocator<const_char_*>_>)._M_impl.
              super__Vector_impl_data._M_start[0x21])(in_RDI,local_18,1);
    local_38 = local_10;
    while (local_38 = local_38 + 1, local_38 < local_18) {
      (*(code *)(in_RDI->super__Vector_base<const_char_*,_std::allocator<const_char_*>_>)._M_impl.
                super__Vector_impl_data._M_start[0x21])(in_RDI,local_38,2);
    }
    ppcVar3 = std::vector<const_char_*,_std::allocator<const_char_*>_>::operator[]
                        ((vector<const_char_*,_std::allocator<const_char_*>_> *)
                         &in_RDI[5].super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                          _M_impl.super__Vector_impl_data._M_finish,local_10);
    *ppcVar3 = (value_type)in_RCX;
  }
  return;
}

Assistant:

void LatticeImpl::set_feature_constraint(size_t begin_pos, size_t end_pos,
                                         const char *feature) {
  if (begin_pos >= end_pos || !feature) {
    return;
  }

  if (feature_constraint_.empty()) {
    feature_constraint_.resize(size() + 4, 0);
  }

  end_pos = std::min(end_pos, size());

  set_boundary_constraint(begin_pos, MECAB_TOKEN_BOUNDARY);
  set_boundary_constraint(end_pos, MECAB_TOKEN_BOUNDARY);
  for (size_t i = begin_pos + 1; i < end_pos; ++i) {
    set_boundary_constraint(i, MECAB_INSIDE_TOKEN);
  }

  feature_constraint_[begin_pos] = feature;
}